

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu2_get_task(void *hal,HalEncTask *task)

{
  MppEncRotationCfg MVar1;
  MppFrameChromaFormat MVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  undefined4 *puVar8;
  uint local_8c;
  int local_88;
  RK_U32 runs_left;
  RK_U32 runs;
  RK_U32 remainder;
  RK_U32 quotient;
  RK_U32 divider;
  RK_U32 *core_ecs;
  RK_U32 ecs_num;
  RK_U32 part_rows;
  RK_U32 mb_h;
  RK_U32 mb_w;
  size_t reg_size;
  void *regs_base;
  MppBuffer buf;
  RK_U32 buf_size;
  RK_U32 height;
  RK_U32 width;
  RK_U32 i;
  JpegeMultiCoreCtx *ctx_ext;
  JpegeSyntax *syntax;
  HalJpegeCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  ctx_ext = (JpegeMultiCoreCtx *)(task->syntax).data;
  _width = *(undefined4 **)((long)hal + 0x170);
  height = 0;
  syntax = (JpegeSyntax *)hal;
  ctx = (HalJpegeCtx *)task;
  task_local = (HalEncTask *)hal;
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p\n","hal_jpege_vepu2_get_task",hal);
  }
  memcpy(&syntax->quality,ctx_ext,0xb8);
  if ((hal_jpege_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","rc_mode %d\n",(char *)0x0,
               (ulong)*(uint *)(*(long *)&syntax->offset_x + 0x94));
  }
  if (*(int *)(*(long *)&syntax->offset_x + 0x94) != 2) {
    if (syntax[1].slice_enable == 0) {
      if (ctx_ext->ecs_cnt[0] == 0) {
        local_88 = 0x50;
      }
      else {
        local_88 = 100 - ctx_ext->ecs_cnt[0];
      }
      *(int *)(*(long *)&ctx->type + 0xb4) = local_88;
      *(RK_U32 *)(*(long *)&ctx->type + 0xbc) = 100 - ctx_ext->ecs_cnt[2];
      *(RK_U32 *)(*(long *)&ctx->type + 0xb8) = 100 - ctx_ext->ecs_cnt[1];
      *(ulong *)(*(long *)&ctx->type + 0x98) =
           *(ulong *)(*(long *)&ctx->type + 0x98) & 0xffffffffffffffef | 0x10;
    }
    else {
      *(undefined4 *)(*(long *)&ctx->type + 0xb4) = *(undefined4 *)&syntax[1].comment_data;
      *(RK_U32 *)(*(long *)&ctx->type + 0xbc) = 100 - ctx_ext->ecs_cnt[2];
      *(RK_U32 *)(*(long *)&ctx->type + 0xb8) = 100 - ctx_ext->ecs_cnt[1];
    }
  }
  sVar6 = mpp_packet_get_length(ctx->cfg);
  syntax[1].low_delay = (RK_U32)sVar6;
  syntax[1].qf_max = 0;
  syntax[1].qf_min = *(RK_S32 *)((long)&ctx_ext->partions_group + 4);
  syntax[1].color_conversion_type = 0;
  syntax[1].coeffA = 0;
  syntax[1].coeffB = 0;
  syntax[1].coeffC = 0;
  syntax[1].coeffE = 0;
  (ctx->syntax).quality = 1;
  (ctx->syntax).q_factor = 0;
  (ctx->syntax).coeffB = 0;
  if ((int)syntax->color < 2) {
    if (_width != (undefined4 *)0x0) {
      *_width = 0;
    }
    if (syntax->hor_stride == 0x13) {
      buf_size = *(uint *)(*(long *)&syntax->offset_x + 0xc);
      buf._4_4_ = *(uint *)(*(long *)&syntax->offset_x + 0x10);
      buf._0_4_ = buf_size * buf._4_4_ >> 1;
      if ((0xe1000 < buf_size * buf._4_4_) || ((0x2d0 < buf._4_4_ && (0x2d0 < buf_size)))) {
        if (_width == (undefined4 *)0x0) {
          _width = (undefined4 *)mpp_osal_calloc("hal_jpege_vepu2_get_task",0xa0);
          *(undefined4 **)(syntax + 2) = _width;
        }
        if ((_width == (undefined4 *)0x0) &&
           (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx_ext",
                       "hal_jpege_vepu2_get_task",0xdd), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if ((*(long *)(_width + 4) == 0) &&
           (mpp_buffer_group_get
                      ((MppBufferGroup *)(_width + 4),0x20004,MPP_BUFFER_INTERNAL,"hal_jpege_vepu2",
                       "hal_jpege_vepu2_get_task"), *(long *)(_width + 4) == 0)) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)(_width + 4),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_jpege_vepu2","hal_jpege_vepu2_get_task");
        }
        if ((*(long *)(_width + 4) == 0) &&
           (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx_ext->partions_group","hal_jpege_vepu2_get_task",0xe5),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if (_width[0xc] != (uint)buf) {
          regs_base = (void *)0x0;
          for (height = 0; height < 3; height = height + 1) {
            regs_base = *(void **)(_width + (ulong)height * 2 + 6);
            if (regs_base != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(regs_base,"hal_jpege_vepu2_get_task");
            }
          }
          mpp_buffer_group_clear(*(MppBufferGroup *)(_width + 4));
          for (height = 0; height < 3; height = height + 1) {
            mpp_buffer_get_with_tag
                      (*(MppBufferGroup *)(_width + 4),&regs_base,(ulong)(uint)buf,"hal_jpege_vepu2"
                       ,"hal_jpege_vepu2_get_task");
            if ((regs_base == (void *)0x0) &&
               (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                           "hal_jpege_vepu2_get_task",0xf4), (mpp_debug & 0x10000000) != 0)) {
              abort();
            }
            *(void **)(_width + (ulong)height * 2 + 6) = regs_base;
          }
          _width[0xc] = (uint)buf;
        }
        if (*(long *)(_width + 0x16) == 0) {
          reg_size = (size_t)mpp_osal_calloc("hal_jpege_vepu2_get_task",
                                             (ulong)(syntax->format_out << 3));
          MVar2 = syntax->format_out;
          *(size_t *)(_width + 0x16) = reg_size;
          for (height = 0; height < 4; height = height + 1) {
            *(size_t *)(_width + (ulong)height * 2 + 0x18) = reg_size;
            lVar7 = MVar2 + reg_size;
            *(long *)(_width + (ulong)height * 2 + 0x20) = lVar7;
            reg_size = (ulong)MVar2 + lVar7;
          }
        }
        uVar3 = buf_size + 0xf >> 4;
        ecs_num = buf._4_4_ + 0xf >> 4;
        core_ecs._4_4_ = ecs_num + 3 >> 2;
        _width[1] = 0;
        if (*(int *)(*(long *)&syntax->offset_x + 0xe94) == 2) {
          uVar3 = ((ecs_num + *(int *)((long)ctx_ext->regs_out + 0x1c)) - 1) /
                  *(uint *)((long)ctx_ext->regs_out + 0x1c);
          puVar8 = _width + 0x11;
          if ((uVar3 < 0x19) && (8 < uVar3)) {
            if (uVar3 < 0x15) {
              if (uVar3 < 0x11) {
                if (8 < uVar3) {
                  _width[0x12] = 4;
                  *puVar8 = 4;
                  _width[0x13] = uVar3 - 8 >> 1;
                  _width[0x14] = (uVar3 - 8) - _width[0x13];
                }
              }
              else {
                *puVar8 = 8;
                _width[0x13] = 4;
                _width[0x12] = 4;
                _width[0x14] = uVar3 - 0x10;
              }
            }
            else {
              _width[0x12] = 8;
              *puVar8 = 8;
              _width[0x13] = uVar3 - 0x10 >> 1;
              _width[0x14] = (uVar3 - 0x10) - _width[0x13];
            }
          }
          else {
            uVar4 = 1;
            if (0x18 < uVar3) {
              uVar4 = 8;
            }
            uVar5 = uVar3 / uVar4 >> 2;
            if (uVar5 != 0) {
              for (height = 0; height < 4; height = height + 1) {
                puVar8[height] = uVar5 * uVar4;
              }
            }
            for (height = 0; height < (uVar3 / uVar4 & 3); height = height + 1) {
              puVar8[height] = uVar4 + puVar8[height];
            }
            _width[0x14] = uVar3 % uVar4 + _width[0x14];
          }
          for (height = 0; height < 4; height = height + 1) {
            _width[(ulong)height + 0xd] = puVar8[height] * *(int *)((long)ctx_ext->regs_out + 0x1c);
            if ((hal_jpege_debug & 4) != 0) {
              _mpp_log_l(4,"hal_jpege_vepu2","part %d, ecs %d, rows %d",(char *)0x0,(ulong)height,
                         (ulong)(uint)puVar8[height],_width[(ulong)height + 0xd]);
            }
            if (puVar8[height] != 0) {
              _width[1] = _width[1] + 1;
            }
          }
        }
        else {
          for (height = 0; height < 4; height = height + 1) {
            if (ecs_num < core_ecs._4_4_) {
              local_8c = ecs_num;
            }
            else {
              local_8c = core_ecs._4_4_;
            }
            core_ecs._4_4_ = local_8c;
            _width[(ulong)height + 0xd] = local_8c;
            _width[(ulong)height + 0x11] = 1;
            if ((hal_jpege_debug & 4) != 0) {
              _mpp_log_l(4,"hal_jpege_vepu2","part %d row %d restart %d\n",(char *)0x0,(ulong)height
                         ,(ulong)local_8c,uVar3 * local_8c);
            }
            if (local_8c != 0) {
              _width[1] = _width[1] + 1;
            }
            if ((height == 0) && (syntax[1].format_out == MPP_CHROMA_UNSPECIFIED)) {
              syntax[1].format_out = uVar3 * local_8c;
            }
            ecs_num = ecs_num - local_8c;
          }
        }
        if (*(long *)(_width + 2) == 0) {
          mpp_dev_multi_offset_init((MppDevRegOffCfgs **)(_width + 2),0x18);
        }
        *(undefined4 *)(ctx_ext->regs_out + 3) = 1;
        *_width = 1;
      }
    }
  }
  else {
    MVar1 = syntax->rotation;
    syntax->rotation = MVar1 + MPP_ENC_ROT_90;
    (ctx->syntax).coeffB = MVar1;
    if ((int)syntax->color <= (int)syntax->rotation) {
      syntax->rotation = MPP_ENC_ROT_0;
    }
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_get_task",task_local);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu2_get_task(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;
    JpegeMultiCoreCtx *ctx_ext = (JpegeMultiCoreCtx *)ctx->ctx_ext;
    RK_U32 i = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    memcpy(&ctx->syntax, syntax, sizeof(ctx->syntax));
    /* Set rc paramters */
    hal_jpege_dbg_input("rc_mode %d\n", ctx->cfg->rc.rc_mode);
    if (ctx->cfg->rc.rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        if (!ctx->hal_rc.q_factor) {
            task->rc_task->info.quality_target = syntax->q_factor ? (100 - syntax->q_factor) : 80;
            task->rc_task->info.quality_min = 100 - syntax->qf_max;
            task->rc_task->info.quality_max = 100 - syntax->qf_min;
            task->rc_task->frm.is_intra = 1;
        } else {
            task->rc_task->info.quality_target = ctx->hal_rc.last_quality;
            task->rc_task->info.quality_min = 100 - syntax->qf_max;
            task->rc_task->info.quality_max = 100 - syntax->qf_min;
        }
    }
    ctx->hal_start_pos = mpp_packet_get_length(task->packet);

    /* prepare for part encoding */
    ctx->mcu_y = 0;
    ctx->mcu_h = syntax->mcu_ver_cnt;
    ctx->sw_bit = 0;
    ctx->part_bytepos = 0;
    ctx->part_x_fill = 0;
    ctx->part_y_fill = 0;
    ctx->rst_marker_idx = 0;
    task->part_first = 1;
    task->part_last = 0;
    task->flags.reg_idx = 0;

    /* rk3588 4 core frame parallel */
    if (ctx->task_cnt > 1) {
        task->flags.reg_idx = ctx->task_idx++;
        if (ctx->task_idx >= ctx->task_cnt)
            ctx->task_idx = 0;
        goto MULTI_CORE_SPLIT_DONE;
    }

    /* Split single task to multi cores on rk3588 */
    if (ctx_ext)
        ctx_ext->multi_core_enabled = 0;

    if (ctx->type == VPU_CLIENT_VEPU2_JPEG) {
        RK_U32 width = ctx->cfg->prep.width;
        RK_U32 height = ctx->cfg->prep.height;
        RK_U32 buf_size = width * height / 2;

        /* small image do not need to split into four segments */
        if (width * height <= 1280 * 720 && (height <= 720 || width <= 720))
            goto MULTI_CORE_SPLIT_DONE;

        if (!ctx_ext) {
            ctx_ext = mpp_calloc(JpegeMultiCoreCtx, 1);
            ctx->ctx_ext = ctx_ext;
        }

        mpp_assert(ctx_ext);

        if (!ctx_ext->partions_group) {
            mpp_buffer_group_get_internal(&ctx_ext->partions_group, MPP_BUFFER_TYPE_DMA_HEAP | MPP_BUFFER_FLAGS_CACHABLE);
            if (!ctx_ext->partions_group)
                mpp_buffer_group_get_internal(&ctx_ext->partions_group, MPP_BUFFER_TYPE_ION);
        }

        mpp_assert(ctx_ext->partions_group);

        if (ctx_ext->buf_size != buf_size) {
            MppBuffer buf = NULL;

            for (i = 0; i < MAX_CORE_NUM - 1; i++) {
                buf = ctx_ext->partions_buf[i];
                if (buf)
                    mpp_buffer_put(buf);
            }

            mpp_buffer_group_clear(ctx_ext->partions_group);

            for (i = 0; i < MAX_CORE_NUM - 1; i++) {
                mpp_buffer_get(ctx_ext->partions_group, &buf, buf_size);
                mpp_assert(buf);
                ctx_ext->partions_buf[i] = buf;
            }

            ctx_ext->buf_size = buf_size;
        }

        if (!ctx_ext->regs_base) {
            void *regs_base = mpp_calloc_size(void, ctx->reg_size * MAX_CORE_NUM * 2);
            size_t reg_size = ctx->reg_size;

            ctx_ext->regs_base = regs_base;
            for (i = 0; i < MAX_CORE_NUM; i++) {
                ctx_ext->regs[i] = regs_base;
                regs_base += reg_size;

                ctx_ext->regs_out[i] = regs_base;
                regs_base += reg_size;
            }
        }

        {
            RK_U32 mb_w = MPP_ALIGN(width, 16) / 16;
            RK_U32 mb_h = MPP_ALIGN(height, 16) / 16;
            RK_U32 part_rows = MPP_ALIGN(mb_h, 4) / 4;

            ctx_ext->partion_num = 0;

            if (ctx->cfg->split.split_mode == MPP_ENC_SPLIT_BY_CTU) {
                RK_U32 ecs_num = (mb_h + syntax->part_rows - 1) / syntax->part_rows;
                RK_U32 *core_ecs = ctx_ext->ecs_cnt;

                if (ecs_num > 24 || ecs_num <= 8) {
                    RK_U32 divider = ecs_num > 24 ? 8 : 1;
                    RK_U32 quotient = ecs_num / divider;
                    RK_U32 remainder = ecs_num % divider;
                    RK_U32 runs = quotient  / MAX_CORE_NUM;
                    RK_U32 runs_left = quotient % MAX_CORE_NUM;

                    if (runs > 0) {
                        for (i = 0; i < MAX_CORE_NUM; i++)
                            core_ecs[i] = runs * divider;
                    }

                    for (i = 0; i < runs_left; i++)
                        core_ecs[i] += divider;

                    core_ecs[MAX_CORE_NUM - 1] += remainder;
                } else if (ecs_num > 20) {
                    core_ecs[0] = core_ecs[1] = 8;
                    core_ecs[2] = (ecs_num - 8 * 2) / 2;
                    core_ecs[3] = ecs_num - 8 * 2 - core_ecs[2];
                } else if (ecs_num > 16) {
                    core_ecs[0] = 8;
                    core_ecs[1] = core_ecs[2] = 4;
                    core_ecs[3] = ecs_num - 8 - 4 * 2;
                } else if (ecs_num > 8) {
                    core_ecs[0] = core_ecs[1] = 4;
                    core_ecs[2] = (ecs_num - 4 * 2) / 2;
                    core_ecs[3] = ecs_num - 4 * 2 - core_ecs[2];
                }

                for (i = 0; i < MAX_CORE_NUM; i++) {
                    ctx_ext->part_rows[i] = core_ecs[i] * syntax->part_rows;
                    hal_jpege_dbg_detail("part %d, ecs %d, rows %d", i, core_ecs[i],
                                         ctx_ext->part_rows[i]);
                    if (core_ecs[i])
                        ctx_ext->partion_num++;
                }
            } else {
                for (i = 0; i < MAX_CORE_NUM; i++) {
                    part_rows = (mb_h >= part_rows) ? part_rows : mb_h;

                    ctx_ext->part_rows[i] = part_rows;
                    ctx_ext->ecs_cnt[i] = 1;

                    hal_jpege_dbg_detail("part %d row %d restart %d\n",
                                         i, part_rows, mb_w * part_rows);

                    if (part_rows)
                        ctx_ext->partion_num++;

                    if (i == 0 && !ctx->syntax.restart_ri)
                        ctx->syntax.restart_ri = mb_w * part_rows;

                    mb_h -= part_rows;
                }
            }
        }

        if (!ctx_ext->reg_cfg)
            mpp_dev_multi_offset_init(&ctx_ext->reg_cfg, 24);

        syntax->low_delay = 1;
        ctx_ext->multi_core_enabled = 1;
    }
MULTI_CORE_SPLIT_DONE:

    hal_jpege_dbg_func("leave hal %p\n", hal);

    return MPP_OK;
}